

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_facelift.c
# Opt level: O3

REF_STATUS ref_facelift_max_distance(REF_FACELIFT ref_facelift,REF_DBL *distance)

{
  double *pdVar1;
  int iVar2;
  REF_DBL *pRVar3;
  REF_NODE pRVar4;
  REF_GEOM pRVar5;
  REF_GLOB *pRVar6;
  REF_INT *pRVar7;
  double dVar8;
  double dVar9;
  REF_STATUS RVar10;
  long lVar11;
  long lVar12;
  double dVar13;
  
  pRVar3 = ref_facelift->displacement;
  if (pRVar3 == (REF_DBL *)0x0) {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c",
           0x51f,"ref_facelift_max_distance","requires indirect facelift");
    RVar10 = 1;
  }
  else {
    pRVar4 = ref_facelift->grid->node;
    pRVar5 = ref_facelift->grid->geom;
    lVar11 = (long)pRVar4->max;
    if (0 < lVar11) {
      pRVar6 = pRVar4->global;
      lVar12 = 0;
      do {
        if (-1 < pRVar6[lVar12]) {
          distance[lVar12] = 0.0;
        }
        lVar12 = lVar12 + 1;
      } while (lVar11 != lVar12);
    }
    lVar11 = (long)pRVar5->max;
    if (0 < lVar11) {
      pRVar7 = pRVar5->descr;
      lVar12 = 0;
      do {
        if (*(int *)((long)pRVar7 + lVar12) != -1) {
          iVar2 = *(int *)((long)pRVar7 + lVar12 + 0x14);
          dVar13 = distance[iVar2];
          pdVar1 = (double *)((long)pRVar3 + lVar12 + 8);
          dVar8 = *pdVar1;
          dVar9 = pdVar1[1];
          if (dVar13 <= SQRT(dVar9 * dVar9 +
                             *(double *)((long)pRVar3 + lVar12) * *(double *)((long)pRVar3 + lVar12)
                             + dVar8 * dVar8)) {
            pdVar1 = (double *)((long)pRVar3 + lVar12 + 8);
            dVar13 = *pdVar1;
            dVar8 = pdVar1[1];
            dVar13 = SQRT(dVar8 * dVar8 +
                          *(double *)((long)pRVar3 + lVar12) * *(double *)((long)pRVar3 + lVar12) +
                          dVar13 * dVar13);
          }
          distance[iVar2] = dVar13;
        }
        lVar12 = lVar12 + 0x18;
      } while (lVar11 * 0x18 != lVar12);
    }
    RVar10 = 0;
  }
  return RVar10;
}

Assistant:

REF_FCN REF_STATUS ref_facelift_max_distance(REF_FACELIFT ref_facelift,
                                             REF_DBL *distance) {
  REF_GRID ref_grid = ref_facelift_grid(ref_facelift);
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_GEOM ref_geom = ref_facelift_geom(ref_facelift);
  REF_INT geom, node;

  RAS(!ref_facelift_direct(ref_facelift), "requires indirect facelift");

  each_ref_node_valid_node(ref_node, node) { distance[node] = 0.0; }

  each_ref_geom(ref_geom, geom) {
    node = ref_geom_node(ref_geom, geom);
    distance[node] =
        MAX(distance[node], ref_facelift_distance(ref_facelift, geom));
  }

  return REF_SUCCESS;
}